

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  string *value;
  cmValue local_48;
  cmValue local_40;
  cmValue def;
  cmValue def_1;
  bool one_local;
  cmExpandedCommandArgument *arg_local;
  cmConditionEvaluator *this_local;
  
  if (one) {
    bVar1 = cmExpandedCommandArgument::operator==(arg,"0");
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = cmExpandedCommandArgument::operator==(arg,"1");
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        def = GetDefinitionIfUnquoted(this,arg);
        bVar1 = cmIsOff(def);
        this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      }
    }
  }
  else {
    local_40 = GetDefinitionIfUnquoted(this,arg);
    bVar1 = cmValue::operator_cast_to_bool(&local_40);
    if (!bVar1) {
      cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
      __nptr = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(__nptr);
      if (iVar2 != 0) {
        value = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
        cmValue::cmValue(&local_48,value);
        local_40.Value = local_48.Value;
      }
    }
    bVar1 = cmIsOff(local_40);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool const one) const
{
  if (one) {
    // Old IsTrue behavior for single argument.
    if (arg == "0") {
      return false;
    }
    if (arg == "1") {
      return true;
    }
    cmValue def = this->GetDefinitionIfUnquoted(arg);
    return !cmIsOff(def);
  }
  // Old GetVariableOrNumber behavior.
  cmValue def = this->GetDefinitionIfUnquoted(arg);
  if (!def && std::atoi(arg.GetValue().c_str())) {
    def = cmValue(arg.GetValue());
  }
  return !cmIsOff(def);
}